

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# baseline.cc
# Opt level: O1

void predict_or_learn<false>(baseline *data,single_learner *base,example *ec)

{
  float *pfVar1;
  float *pfVar2;
  unsigned_long *puVar3;
  
  if (data->check_enabled == true) {
    pfVar2 = (ec->super_example_predict).feature_space[0x89].values._begin;
    pfVar1 = (ec->super_example_predict).feature_space[0x89].values._end;
    if (pfVar2 != pfVar1) {
      puVar3 = (ec->super_example_predict).feature_space[0x89].indicies._begin;
      do {
        if (*puVar3 == 0x54d) {
          if (*pfVar2 == 1.0) goto LAB_00215c89;
          break;
        }
        pfVar2 = pfVar2 + 1;
        puVar3 = puVar3 + 1;
      } while (pfVar2 != pfVar1);
    }
  }
  else {
LAB_00215c89:
    if (data->global_only == true) {
      if (data->global_initialized == false) {
        init_global(data);
        data->global_initialized = true;
      }
      VW::copy_example_metadata(false,data->ec,ec);
      (**(code **)(base + 0x30))(*(undefined8 *)(base + 0x18),*(undefined8 *)(base + 0x20),data->ec)
      ;
      (ec->l).simple.initial = (data->ec->pred).scalar;
    }
  }
  (**(code **)(base + 0x30))(*(undefined8 *)(base + 0x18),*(undefined8 *)(base + 0x20),ec);
  return;
}

Assistant:

void predict_or_learn(baseline& data, single_learner& base, example& ec)
{
  // no baseline if check_enabled is true and example contains flag
  if (data.check_enabled && !BASELINE::baseline_enabled(&ec))
  {
    if (is_learn)
      base.learn(ec);
    else
      base.predict(ec);
    return;
  }

  // always do a full prediction, for safety in accurate predictive validation
  if (data.global_only)
  {
    if (!data.global_initialized)
    {
      init_global(data);
      data.global_initialized = true;
    }
    VW::copy_example_metadata(/*audit=*/false, data.ec, &ec);
    base.predict(*data.ec);
    ec.l.simple.initial = data.ec->pred.scalar;
    base.predict(ec);
  }
  else
    base.predict(ec);

  if (is_learn)
  {
    const float pred = ec.pred.scalar;  // save 'safe' prediction

    // now learn
    data.ec->l.simple = ec.l.simple;
    if (!data.global_only)
    {
      // move label & constant features data over to baseline example
      VW::copy_example_metadata(/*audit=*/false, data.ec, &ec);
      VW::move_feature_namespace(data.ec, &ec, constant_namespace);
    }

    // regress baseline on label
    if (data.lr_scaling)
    {
      float multiplier = data.lr_multiplier;
      if (multiplier == 0)
      {
        multiplier = max<float>(0.0001f, max<float>(abs(data.all->sd->min_label), abs(data.all->sd->max_label)));
        if (multiplier > max_multiplier)
          multiplier = max_multiplier;
      }
      data.all->eta *= multiplier;
      base.learn(*data.ec);
      data.all->eta /= multiplier;
    }
    else
      base.learn(*data.ec);

    // regress residual
    ec.l.simple.initial = data.ec->pred.scalar;
    base.learn(ec);

    if (!data.global_only)
    {
      // move feature data back to the original example
      VW::move_feature_namespace(&ec, data.ec, constant_namespace);
    }

    // return the safe prediction
    ec.pred.scalar = pred;
  }
}